

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

bool __thiscall BigInt::operator<(BigInt *this,BigInt *v)

{
  int iVar1;
  long lVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  int local_24;
  int i;
  BigInt *v_local;
  BigInt *this_local;
  
  if (this->sign == v->sign) {
    sVar3 = std::vector<long_long,_std::allocator<long_long>_>::size(&this->vector_value);
    sVar4 = std::vector<long_long,_std::allocator<long_long>_>::size(&v->vector_value);
    if (sVar3 == sVar4) {
      sVar3 = std::vector<long_long,_std::allocator<long_long>_>::size(&this->vector_value);
      local_24 = (int)sVar3;
      do {
        local_24 = local_24 + -1;
        if (local_24 < 0) {
          return false;
        }
        pvVar5 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                           (&this->vector_value,(long)local_24);
        lVar2 = *pvVar5;
        pvVar5 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                           (&v->vector_value,(long)local_24);
      } while (lVar2 == *pvVar5);
      pvVar5 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                         (&this->vector_value,(long)local_24);
      lVar2 = *pvVar5;
      iVar1 = this->sign;
      pvVar5 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                         (&v->vector_value,(long)local_24);
      this_local._7_1_ = lVar2 * iVar1 < *pvVar5 * (long)this->sign;
    }
    else {
      sVar3 = std::vector<long_long,_std::allocator<long_long>_>::size(&this->vector_value);
      iVar1 = this->sign;
      sVar4 = std::vector<long_long,_std::allocator<long_long>_>::size(&v->vector_value);
      this_local._7_1_ = sVar3 * (long)iVar1 < sVar4 * (long)v->sign;
    }
  }
  else {
    this_local._7_1_ = this->sign < v->sign;
  }
  return this_local._7_1_;
}

Assistant:

bool operator<(const BigInt &v) const {
        if (sign != v.sign)//! sign
            return sign < v.sign;
        if (vector_value.size() != v.vector_value.size()) //! size
            return vector_value.size() * sign < v.vector_value.size() * v.sign;
        for (auto i = static_cast<int>(vector_value.size() - 1); i >= 0; i--) //! value
            if (vector_value[i] != v.vector_value[i])
                return vector_value[i] * sign < v.vector_value[i] * sign;
        return false;
    }